

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_utils.h
# Opt level: O1

wcharstring * fromUTF8(wcharstring *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  char *__first;
  pointer pcVar2;
  pointer pcVar3;
  u16string utf16;
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  convert2;
  wide_string local_90;
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  local_70;
  
  local_70._M_cvt._M_t.
  super___uniq_ptr_impl<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
  .super__Head_base<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>,_true,_true>
                  )operator_new(0x20);
  *(undefined4 *)
   &((codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0> *)
    local_70._M_cvt._M_t.
    super___uniq_ptr_impl<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
    .super__Head_base<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>.
    _M_head_impl)->field_0x8 = 0;
  *(char **)&((codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0> *)
             local_70._M_cvt._M_t.
             super___uniq_ptr_impl<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
             .
             super__Head_base<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
             ._M_head_impl)->field_0x10 = "14_M_get_deleterERKSt9type_info";
  *(undefined4 *)
   &((codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0> *)
    local_70._M_cvt._M_t.
    super___uniq_ptr_impl<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
    .super__Head_base<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>.
    _M_head_impl)->field_0x18 = 0;
  *(undefined ***)
   local_70._M_cvt._M_t.
   super___uniq_ptr_impl<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
   .super__Head_base<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>.
   _M_head_impl = &PTR____codecvt_utf8_base_0016e668;
  local_70._M_byte_err_string._M_dataplus._M_p = (pointer)&local_70._M_byte_err_string.field_2;
  local_70._M_byte_err_string._M_string_length = 0;
  local_70._M_byte_err_string.field_2._M_local_buf[0] = '\0';
  local_70._M_wide_err_string._M_dataplus._M_p = (pointer)&local_70._M_wide_err_string.field_2;
  local_70._M_wide_err_string._M_string_length = 0;
  local_70._M_wide_err_string.field_2._M_local_buf[0] = L'\0';
  local_70._M_state.__count = 0;
  local_70._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  local_70._M_count = 0;
  local_70._M_with_cvtstate = false;
  local_70._M_with_strings = false;
  __first = (str->_M_dataplus)._M_p;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::from_bytes(&local_90,&local_70,__first,__first + str->_M_string_length);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_90._M_dataplus._M_p == (pointer)0x0) {
    pcVar3 = (pointer)0x2;
  }
  else {
    pcVar2 = local_90._M_dataplus._M_p + -1;
    do {
      pcVar3 = pcVar2 + 1;
      pcVar1 = pcVar2 + 1;
      pcVar2 = pcVar3;
    } while (*pcVar1 != L'\0');
  }
  std::__cxx11::
  basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>::
  _M_construct<unsigned_short_const*>
            ((basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>
              *)__return_storage_ptr__,local_90._M_dataplus._M_p,pcVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity * 2 + 2);
  }
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::~wstring_convert(&local_70);
  return __return_storage_ptr__;
}

Assistant:

wcharstring fromUTF8(const std::string &str)
{
    std::wstring_convert<std::codecvt_utf8<char16_t>, char16_t> convert2;
    std::u16string utf16 = convert2.from_bytes(str);
    return wcharstring((WCHAR*)utf16.data());
}